

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

FileName * __thiscall embree::FileName::operator+(FileName *this,string *other)

{
  string *in_RDX;
  FileName *in_RSI;
  FileName *in_RDI;
  FileName *unaff_retaddr;
  FileName *in_stack_00000008;
  
  FileName(in_RSI,in_RDX);
  operator+(in_stack_00000008,unaff_retaddr);
  ~FileName((FileName *)0x4a01bd);
  return in_RDI;
}

Assistant:

FileName FileName::operator +( const std::string& other ) const {
    return operator+(FileName(other));
  }